

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.hpp
# Opt level: O1

string * __thiscall
duckdb::FullLinePosition::
ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
          (string *__return_storage_ptr__,FullLinePosition *this,bool *first_char_nl,
          unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
          *buffer_handles,bool reconstruct_line)

{
  idx_t *__k;
  idx_t *__k_00;
  data_t dVar1;
  ulong uVar2;
  idx_t iVar3;
  __node_base_ptr p_Var4;
  mapped_type *pmVar5;
  CSVBufferHandle *pCVar6;
  size_type *psVar7;
  bool bVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined7 in_register_00000081;
  optional_ptr<duckdb::FileBuffer,_true> *poVar10;
  ulong uVar11;
  ulong uVar12;
  string local_60;
  bool *local_40;
  data_ptr_t local_38;
  
  if (((int)CONCAT71(in_register_00000081,reconstruct_line) == 0) ||
     ((((this->begin).buffer_pos == (this->end).buffer_pos &&
       ((this->begin).buffer_idx == (this->end).buffer_idx)) &&
      ((this->begin).buffer_size == (this->end).buffer_size)))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  __k = &(this->end).buffer_idx;
  uVar11 = (this->begin).buffer_idx;
  uVar12 = (this->end).buffer_idx;
  __k_00 = &(this->begin).buffer_idx;
  uVar2 = (buffer_handles->_M_h)._M_bucket_count;
  local_40 = first_char_nl;
  if (uVar12 == uVar11) {
    p_Var4 = ::std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node(&buffer_handles->_M_h,uVar12 % uVar2,__k,uVar12);
    if ((p_Var4 != (__node_base_ptr)0x0) && (p_Var4->_M_nxt != (_Hash_node_base *)0x0)) {
      pmVar5 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)buffer_handles,__k_00);
      pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
      poVar10 = &(pCVar6->handle).node;
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(poVar10);
      iVar3 = (this->begin).buffer_pos;
      dVar1 = poVar10->ptr->buffer[iVar3];
      bVar8 = dVar1 == '\r' || dVar1 == '\n';
      *local_40 = bVar8;
      uVar11 = bVar8 + iVar3;
      if (uVar11 < (this->end).buffer_pos) {
        do {
          ::std::__cxx11::string::push_back((char)&local_60);
          uVar11 = uVar11 + 1;
        } while (uVar11 < (this->end).buffer_pos);
      }
LAB_015154b9:
      SanitizeError(&local_60);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      paVar9 = &local_60.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == paVar9) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,local_60.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_60.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_60._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,local_60.field_2._M_local_buf[0])
        ;
      }
      psVar7 = &local_60._M_string_length;
      __return_storage_ptr__->_M_string_length = local_60._M_string_length;
      local_60._M_dataplus._M_p = (pointer)paVar9;
      goto LAB_0151550d;
    }
  }
  else {
    p_Var4 = ::std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node(&buffer_handles->_M_h,uVar11 % uVar2,__k_00,uVar11);
    if (((p_Var4 != (__node_base_ptr)0x0) && (p_Var4->_M_nxt != (_Hash_node_base *)0x0)) &&
       ((p_Var4 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_find_before_node
                            (&buffer_handles->_M_h,*__k % (buffer_handles->_M_h)._M_bucket_count,__k
                             ,*__k), p_Var4 != (__node_base_ptr)0x0 &&
        (p_Var4->_M_nxt != (_Hash_node_base *)0x0)))) {
      pmVar5 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)buffer_handles,__k_00);
      pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
      poVar10 = &(pCVar6->handle).node;
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(poVar10);
      local_38 = poVar10->ptr->buffer;
      pmVar5 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)buffer_handles,__k_00);
      pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
      uVar11 = pCVar6->actual_size;
      pmVar5 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)buffer_handles,__k);
      pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pCVar6->handle).node);
      iVar3 = (this->begin).buffer_pos;
      bVar8 = local_38[iVar3] == '\r' || local_38[iVar3] == '\n';
      *local_40 = bVar8;
      uVar12 = bVar8 + iVar3;
      if (uVar12 < uVar11) {
        do {
          ::std::__cxx11::string::push_back((char)&local_60);
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar11);
      }
      if ((this->end).buffer_pos != 0) {
        uVar11 = 0;
        do {
          ::std::__cxx11::string::push_back((char)&local_60);
          uVar11 = uVar11 + 1;
        } while (uVar11 < (this->end).buffer_pos);
      }
      goto LAB_015154b9;
    }
  }
  paVar9 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar9;
  psVar7 = &__return_storage_ptr__->_M_string_length;
LAB_0151550d:
  *psVar7 = 0;
  paVar9->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ReconstructCurrentLine(bool &first_char_nl, T &buffer_handles, bool reconstruct_line) const {
		if (!reconstruct_line || begin == end) {
			return {};
		}
		string result;
		if (end.buffer_idx == begin.buffer_idx) {
			if (buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto buffer = buffer_handles[begin.buffer_idx]->Ptr();
			first_char_nl = buffer[begin.buffer_pos] == '\n' || buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < end.buffer_pos; i++) {
				result += buffer[i];
			}
		} else {
			if (buffer_handles.find(begin.buffer_idx) == buffer_handles.end() ||
			    buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto first_buffer = buffer_handles[begin.buffer_idx]->Ptr();
			auto first_buffer_size = buffer_handles[begin.buffer_idx]->actual_size;
			auto second_buffer = buffer_handles[end.buffer_idx]->Ptr();
			first_char_nl = first_buffer[begin.buffer_pos] == '\n' || first_buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < first_buffer_size; i++) {
				result += first_buffer[i];
			}
			for (idx_t i = 0; i < end.buffer_pos; i++) {
				result += second_buffer[i];
			}
		}
		// sanitize borked line
		SanitizeError(result);
		return result;
	}